

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

_Bool upb_MiniTable_SetSubEnum
                (upb_MiniTable *table,upb_MiniTableField *field,upb_MiniTableEnum *sub)

{
  ushort uVar1;
  upb_MiniTableSubInternal *puVar2;
  upb_MiniTableSub uVar3;
  bool bVar4;
  upb_MiniTableSub *table_sub;
  upb_MiniTableEnum *sub_local;
  upb_MiniTableField *field_local;
  upb_MiniTable *table_local;
  
  if ((table->fields_dont_copy_me__upb_internal_use_only <= field) &&
     (field < table->fields_dont_copy_me__upb_internal_use_only +
              (int)(uint)table->field_count_dont_copy_me__upb_internal_use_only)) {
    if (sub == (upb_MiniTableEnum *)0x0) {
      __assert_fail("sub",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/link.c"
                    ,0x47,
                    "_Bool upb_MiniTable_SetSubEnum(upb_MiniTable *, upb_MiniTableField *, const upb_MiniTableEnum *)"
                   );
    }
    bVar4 = field->descriptortype_dont_copy_me__upb_internal_use_only == '\x0e';
    if (bVar4) {
      puVar2 = table->subs_dont_copy_me__upb_internal_use_only;
      uVar1 = field->submsg_index_dont_copy_me__upb_internal_use_only;
      uVar3 = upb_MiniTableSub_FromEnum(sub);
      *(upb_MiniTableSub *)(puVar2 + uVar1) = uVar3;
    }
    return bVar4;
  }
  __assert_fail("(uintptr_t)table->fields_dont_copy_me__upb_internal_use_only <= (uintptr_t)field && (uintptr_t)field < (uintptr_t)(table->fields_dont_copy_me__upb_internal_use_only + table->field_count_dont_copy_me__upb_internal_use_only)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/link.c"
                ,0x46,
                "_Bool upb_MiniTable_SetSubEnum(upb_MiniTable *, upb_MiniTableField *, const upb_MiniTableEnum *)"
               );
}

Assistant:

bool upb_MiniTable_SetSubEnum(upb_MiniTable* table, upb_MiniTableField* field,
                              const upb_MiniTableEnum* sub) {
  UPB_ASSERT((uintptr_t)table->UPB_PRIVATE(fields) <= (uintptr_t)field &&
             (uintptr_t)field < (uintptr_t)(table->UPB_PRIVATE(fields) +
                                            table->UPB_PRIVATE(field_count)));
  UPB_ASSERT(sub);

  if (field->UPB_PRIVATE(descriptortype) != kUpb_FieldType_Enum) {
    return false;
  }

  upb_MiniTableSub* table_sub =
      (void*)&table->UPB_PRIVATE(subs)[field->UPB_PRIVATE(submsg_index)];
  *table_sub = upb_MiniTableSub_FromEnum(sub);
  return true;
}